

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowDemoWindowPopups(void)

{
  bool bVar1;
  bool unused_open;
  ImVec2 center;
  ImGuiColorEditFlags in_stack_0000007c;
  float *in_stack_00000080;
  char *in_stack_00000088;
  char buf [64];
  int n;
  char *names_1 [5];
  int i_2;
  int i_1;
  int i;
  char *names [5];
  undefined4 in_stack_fffffffffffffe68;
  ImGuiPopupFlags in_stack_fffffffffffffe6c;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  float v_max;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  float in_stack_fffffffffffffea0;
  ImGuiStyleVar in_stack_fffffffffffffea4;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  ImVec2 in_stack_fffffffffffffeb0;
  ImVec2 in_stack_fffffffffffffeb8;
  ImVec2 in_stack_fffffffffffffec0;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  char local_108 [56];
  ImVec2 local_c4;
  ImVec2 *in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  char *in_stack_ffffffffffffff58;
  int local_9c;
  undefined8 local_98 [5];
  ImVec2 local_6c;
  bool *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  ImVec2 local_50;
  int local_48;
  ImVec2 local_44;
  ImVec2 local_3c;
  int local_34;
  ImVec2 local_30;
  undefined8 local_28 [5];
  
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
               ,0xcb8,"Popups",GImGuiDemoMarkerCallbackUserData);
  }
  bVar1 = ImGui::CollapsingHeader
                    (in_stack_fffffffffffffe78,
                     (ImGuiTreeNodeFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  if (bVar1) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0xcce,"Popups/Popups",GImGuiDemoMarkerCallbackUserData);
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (bVar1) {
      ImGui::TextWrapped(
                        "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                        );
      memcpy(local_28,&PTR_anon_var_dwarf_3bda2_00213600,0x28);
      ImVec2::ImVec2(&local_30,0.0,0.0);
      bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
      ;
      if (bVar1) {
        ImGui::OpenPopup(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      }
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      if (ShowDemoWindowPopups::selected_fish == -1) {
        in_stack_fffffffffffffe88 = "<None>";
      }
      else {
        in_stack_fffffffffffffe88 = (char *)local_28[ShowDemoWindowPopups::selected_fish];
      }
      ImGui::TextUnformatted
                (in_stack_fffffffffffffe70,
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      bVar1 = ImGui::BeginPopup(in_stack_fffffffffffffe78,
                                (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      if (bVar1) {
        ImGui::Text("Aquarium");
        ImGui::Separator();
        for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
          in_stack_fffffffffffffe80 = (char *)local_28[local_34];
          ImVec2::ImVec2(&local_3c,0.0,0.0);
          bVar1 = ImGui::Selectable(in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57,
                                    (ImGuiSelectableFlags)in_stack_ffffffffffffff50,
                                    in_stack_ffffffffffffff48);
          if (bVar1) {
            ShowDemoWindowPopups::selected_fish = local_34;
          }
        }
        ImGui::EndPopup();
      }
      ImVec2::ImVec2(&local_44,0.0,0.0);
      bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
      ;
      if (bVar1) {
        ImGui::OpenPopup(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      }
      bVar1 = ImGui::BeginPopup(in_stack_fffffffffffffe78,
                                (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      if (bVar1) {
        for (local_48 = 0; local_48 < 5; local_48 = local_48 + 1) {
          ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                          in_stack_fffffffffffffe90,(bool *)in_stack_fffffffffffffe88,
                          SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0));
        }
        bVar1 = ImGui::BeginMenu(in_stack_fffffffffffffe70,
                                 SUB41((uint)in_stack_fffffffffffffe6c >> 0x18,0));
        if (bVar1) {
          ImGui::MenuItem(in_stack_fffffffffffffe70,
                          (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                          false,false);
          ImGui::EndMenu();
        }
        ImGui::Separator();
        ImGui::Text("Tooltip here");
        bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffe80);
        if (bVar1) {
          ImGui::SetTooltip("I am a tooltip over a popup");
        }
        ImVec2::ImVec2(&local_50,0.0,0.0);
        bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (bVar1) {
          ImGui::OpenPopup(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        }
        bVar1 = ImGui::BeginPopup(in_stack_fffffffffffffe78,
                                  (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
        if (bVar1) {
          for (in_stack_ffffffffffffffac = 0; in_stack_ffffffffffffffac < 5;
              in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
            ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            in_stack_fffffffffffffe90,(bool *)in_stack_fffffffffffffe88,
                            SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0));
          }
          bVar1 = ImGui::BeginMenu(in_stack_fffffffffffffe70,
                                   SUB41((uint)in_stack_fffffffffffffe6c >> 0x18,0));
          if (bVar1) {
            ImGui::MenuItem(in_stack_fffffffffffffe70,
                            (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                            false,false);
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,0.0,0.0);
            bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                                  (ImVec2 *)
                                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
            if (bVar1) {
              ImGui::OpenPopup(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
            }
            bVar1 = ImGui::BeginPopup(in_stack_fffffffffffffe78,
                                      (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
            if (bVar1) {
              ImGui::Text("I am the last one here.");
              ImGui::EndPopup();
            }
            ImGui::EndMenu();
          }
          ImGui::EndPopup();
        }
        ImGui::EndPopup();
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff9c,0.0,0.0);
      bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
      ;
      if (bVar1) {
        ImGui::OpenPopup(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      }
      bVar1 = ImGui::BeginPopup(in_stack_fffffffffffffe78,
                                (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      if (bVar1) {
        bVar1 = ImGui::BeginMenuBar();
        if (bVar1) {
          bVar1 = ImGui::BeginMenu(in_stack_fffffffffffffe70,
                                   SUB41((uint)in_stack_fffffffffffffe6c >> 0x18,0));
          if (bVar1) {
            ShowExampleMenuFile();
            ImGui::EndMenu();
          }
          bVar1 = ImGui::BeginMenu(in_stack_fffffffffffffe70,
                                   SUB41((uint)in_stack_fffffffffffffe6c >> 0x18,0));
          if (bVar1) {
            ImGui::MenuItem(in_stack_fffffffffffffe70,
                            (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                            false,false);
            ImGui::EndMenu();
          }
          ImGui::EndMenuBar();
        }
        ImGui::Text("Hello from popup!");
        ImVec2::ImVec2(&local_6c,0.0,0.0);
        ImGui::Button(in_stack_fffffffffffffe70,
                      (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        ImGui::EndPopup();
      }
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0xd2d,"Popups/Context menus",GImGuiDemoMarkerCallbackUserData);
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    v_max = (float)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    if (bVar1) {
      HelpMarker((char *)0x17744c);
      memcpy(local_98,&PTR_anon_var_dwarf_3bef2_00213630,0x28);
      for (local_9c = 0; v_max = (float)((ulong)in_stack_fffffffffffffe78 >> 0x20), local_9c < 5;
          local_9c = local_9c + 1) {
        in_stack_fffffffffffffe78 = (char *)local_98[local_9c];
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff5c,0.0,0.0);
        ImGui::Selectable(in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57,
                          (ImGuiSelectableFlags)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
        ;
        bVar1 = ImGui::BeginPopupContextItem
                          (in_stack_fffffffffffffe88,
                           (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe80 >> 0x20));
        if (bVar1) {
          ImGui::Text("This a popup for \"%s\"!",local_98[local_9c]);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff54,0.0,0.0);
          bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          if (bVar1) {
            ImGui::CloseCurrentPopup();
          }
          ImGui::EndPopup();
        }
        bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffe80);
        if (bVar1) {
          ImGui::SetTooltip("Right-click to open popup");
        }
      }
      HelpMarker((char *)0x177564);
      ImGui::Text((char *)(double)ShowDemoWindowPopups::value,
                  "Value = %.3f <-- (1) right-click this value");
      bVar1 = ImGui::BeginPopupContextItem
                        (in_stack_fffffffffffffe88,
                         (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      if (bVar1) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff4c,0.0,0.0);
        bVar1 = ImGui::Selectable(in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57,
                                  (ImGuiSelectableFlags)in_stack_ffffffffffffff50,
                                  in_stack_ffffffffffffff48);
        if (bVar1) {
          ShowDemoWindowPopups::value = 0.0;
        }
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff44,0.0,0.0);
        bVar1 = ImGui::Selectable(in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57,
                                  (ImGuiSelectableFlags)in_stack_ffffffffffffff50,
                                  in_stack_ffffffffffffff48);
        if (bVar1) {
          ShowDemoWindowPopups::value = 3.1415;
        }
        ImGui::SetNextItemWidth(-1.1754944e-38);
        ImGui::DragFloat(in_stack_fffffffffffffe90,(float *)in_stack_fffffffffffffe88,
                         (float)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                         SUB84(in_stack_fffffffffffffe80,0),v_max,in_stack_fffffffffffffe70,
                         in_stack_fffffffffffffe6c);
        ImGui::EndPopup();
      }
      ImGui::Text("(2) Or right-click this text");
      ImGui::OpenPopupOnItemClick
                (in_stack_fffffffffffffe90,
                 (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      ImVec2::ImVec2(&local_c4,0.0,0.0);
      bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
      ;
      if (bVar1) {
        ImGui::OpenPopup(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      }
      HelpMarker((char *)0x1776b7);
      sprintf(local_108,"Button: %s###Button",ShowDemoWindowPopups::name);
      in_stack_fffffffffffffe70 = local_108;
      ImVec2::ImVec2(&local_110,0.0,0.0);
      ImGui::Button(in_stack_fffffffffffffe70,
                    (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      bVar1 = ImGui::BeginPopupContextItem
                        (in_stack_fffffffffffffe88,
                         (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      if (bVar1) {
        ImGui::Text("Edit name:");
        ImGui::InputText((char *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                         (size_t)in_stack_fffffffffffffeb0,
                         (ImGuiInputTextFlags)in_stack_fffffffffffffeac,
                         (ImGuiInputTextCallback)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (void *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        ImVec2::ImVec2(&local_118,0.0,0.0);
        bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (bVar1) {
          ImGui::CloseCurrentPopup();
        }
        ImGui::EndPopup();
      }
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      ImGui::Text("(<-- right-click here)");
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0xd82,"Popups/Modals",GImGuiDemoMarkerCallbackUserData);
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (bVar1) {
      ImGui::TextWrapped(
                        "Modal windows are like popups but the user cannot close them by clicking outside."
                        );
      ImVec2::ImVec2(&local_120,0.0,0.0);
      bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
      ;
      if (bVar1) {
        ImGui::OpenPopup(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      }
      ImGui::GetMainViewport();
      local_128 = ImGuiViewport::GetCenter
                            ((ImGuiViewport *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      ImVec2::ImVec2(&local_130,0.5,0.5);
      ImGui::SetNextWindowPos(&local_128,8,&local_130);
      bVar1 = ImGui::BeginPopupModal
                        ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                         (bool *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (ImGuiWindowFlags)in_stack_fffffffffffffe9c);
      if (bVar1) {
        ImGui::Text(
                   "All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n"
                   );
        ImGui::Separator();
        ImVec2::ImVec2(&local_138,0.0,0.0);
        ImGui::PushStyleVar(in_stack_fffffffffffffea4,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
        ;
        ImGui::Checkbox((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa0);
        ImGui::PopStyleVar((int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffec0,120.0,0.0);
        bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (bVar1) {
          ImGui::CloseCurrentPopup();
        }
        ImGui::SetItemDefaultFocus();
        ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                        SUB84(in_stack_fffffffffffffe70,0));
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffeb8,120.0,0.0);
        bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (bVar1) {
          ImGui::CloseCurrentPopup();
        }
        ImGui::EndPopup();
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffeb0,0.0,0.0);
      bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
      ;
      if (bVar1) {
        ImGui::OpenPopup(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      }
      bVar1 = ImGui::BeginPopupModal
                        ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                         (bool *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (ImGuiWindowFlags)in_stack_fffffffffffffe9c);
      if (bVar1) {
        bVar1 = ImGui::BeginMenuBar();
        if (bVar1) {
          bVar1 = ImGui::BeginMenu(in_stack_fffffffffffffe70,
                                   SUB41((uint)in_stack_fffffffffffffe6c >> 0x18,0));
          if (bVar1) {
            ImGui::MenuItem(in_stack_fffffffffffffe70,
                            (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                            false,false);
            ImGui::EndMenu();
          }
          ImGui::EndMenuBar();
        }
        ImGui::Text(
                   "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
                   );
        ImGui::Combo(in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe80,(int)v_max);
        ImGui::ColorEdit4(in_stack_00000088,in_stack_00000080,in_stack_0000007c);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffea8,0.0,0.0);
        bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (bVar1) {
          ImGui::OpenPopup(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        }
        bVar1 = ImGui::BeginPopupModal
                          ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           (bool *)CONCAT44(CONCAT13(1,(int3)in_stack_fffffffffffffea4),
                                            in_stack_fffffffffffffea0),
                           (ImGuiWindowFlags)in_stack_fffffffffffffe9c);
        if (bVar1) {
          ImGui::Text("Hello from Stacked The Second!");
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe9c,0.0,0.0);
          bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          if (bVar1) {
            ImGui::CloseCurrentPopup();
          }
          ImGui::EndPopup();
        }
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe94,0.0,0.0);
        bVar1 = ImGui::Button(in_stack_fffffffffffffe70,
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (bVar1) {
          ImGui::CloseCurrentPopup();
        }
        ImGui::EndPopup();
      }
      ImGui::TreePop();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0xdce,"Popups/Menus inside a regular window",GImGuiDemoMarkerCallbackUserData);
    }
    bVar1 = ImGui::TreeNode((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (bVar1) {
      ImGui::TextWrapped(
                        "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                        );
      ImGui::Separator();
      ImGui::PushID(in_stack_fffffffffffffe80);
      ImGui::MenuItem(in_stack_fffffffffffffe70,
                      (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),false,
                      false);
      bVar1 = ImGui::BeginMenu(in_stack_fffffffffffffe70,
                               SUB41((uint)in_stack_fffffffffffffe6c >> 0x18,0));
      if (bVar1) {
        ShowExampleMenuFile();
        ImGui::EndMenu();
      }
      ImGui::PopID();
      ImGui::Separator();
      ImGui::TreePop();
    }
  }
  return;
}

Assistant:

static void ShowDemoWindowPopups()
{
    IMGUI_DEMO_MARKER("Popups");
    if (!ImGui::CollapsingHeader("Popups & Modal windows"))
        return;

    // The properties of popups windows are:
    // - They block normal mouse hovering detection outside them. (*)
    // - Unless modal, they can be closed by clicking anywhere outside them, or by pressing ESCAPE.
    // - Their visibility state (~bool) is held internally by Dear ImGui instead of being held by the programmer as
    //   we are used to with regular Begin() calls. User can manipulate the visibility state by calling OpenPopup().
    // (*) One can use IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup) to bypass it and detect hovering even
    //     when normally blocked by a popup.
    // Those three properties are connected. The library needs to hold their visibility state BECAUSE it can close
    // popups at any time.

    // Typical use for regular windows:
    //   bool my_tool_is_active = false; if (ImGui::Button("Open")) my_tool_is_active = true; [...] if (my_tool_is_active) Begin("My Tool", &my_tool_is_active) { [...] } End();
    // Typical use for popups:
    //   if (ImGui::Button("Open")) ImGui::OpenPopup("MyPopup"); if (ImGui::BeginPopup("MyPopup") { [...] EndPopup(); }

    // With popups we have to go through a library call (here OpenPopup) to manipulate the visibility state.
    // This may be a bit confusing at first but it should quickly make sense. Follow on the examples below.

    IMGUI_DEMO_MARKER("Popups/Popups");
    if (ImGui::TreeNode("Popups"))
    {
        ImGui::TextWrapped(
            "When a popup is active, it inhibits interacting with windows that are behind the popup. "
            "Clicking outside the popup closes it.");

        static int selected_fish = -1;
        const char* names[] = { "Bream", "Haddock", "Mackerel", "Pollock", "Tilefish" };
        static bool toggles[] = { true, false, false, false, false };

        // Simple selection popup (if you want to show the current selection inside the Button itself,
        // you may want to build a string using the "###" operator to preserve a constant ID with a variable label)
        if (ImGui::Button("Select.."))
            ImGui::OpenPopup("my_select_popup");
        ImGui::SameLine();
        ImGui::TextUnformatted(selected_fish == -1 ? "<None>" : names[selected_fish]);
        if (ImGui::BeginPopup("my_select_popup"))
        {
            ImGui::Text("Aquarium");
            ImGui::Separator();
            for (int i = 0; i < IM_ARRAYSIZE(names); i++)
                if (ImGui::Selectable(names[i]))
                    selected_fish = i;
            ImGui::EndPopup();
        }

        // Showing a menu with toggles
        if (ImGui::Button("Toggle.."))
            ImGui::OpenPopup("my_toggle_popup");
        if (ImGui::BeginPopup("my_toggle_popup"))
        {
            for (int i = 0; i < IM_ARRAYSIZE(names); i++)
                ImGui::MenuItem(names[i], "", &toggles[i]);
            if (ImGui::BeginMenu("Sub-menu"))
            {
                ImGui::MenuItem("Click me");
                ImGui::EndMenu();
            }

            ImGui::Separator();
            ImGui::Text("Tooltip here");
            if (ImGui::IsItemHovered())
                ImGui::SetTooltip("I am a tooltip over a popup");

            if (ImGui::Button("Stacked Popup"))
                ImGui::OpenPopup("another popup");
            if (ImGui::BeginPopup("another popup"))
            {
                for (int i = 0; i < IM_ARRAYSIZE(names); i++)
                    ImGui::MenuItem(names[i], "", &toggles[i]);
                if (ImGui::BeginMenu("Sub-menu"))
                {
                    ImGui::MenuItem("Click me");
                    if (ImGui::Button("Stacked Popup"))
                        ImGui::OpenPopup("another popup");
                    if (ImGui::BeginPopup("another popup"))
                    {
                        ImGui::Text("I am the last one here.");
                        ImGui::EndPopup();
                    }
                    ImGui::EndMenu();
                }
                ImGui::EndPopup();
            }
            ImGui::EndPopup();
        }

        // Call the more complete ShowExampleMenuFile which we use in various places of this demo
        if (ImGui::Button("With a menu.."))
            ImGui::OpenPopup("my_file_popup");
        if (ImGui::BeginPopup("my_file_popup", ImGuiWindowFlags_MenuBar))
        {
            if (ImGui::BeginMenuBar())
            {
                if (ImGui::BeginMenu("File"))
                {
                    ShowExampleMenuFile();
                    ImGui::EndMenu();
                }
                if (ImGui::BeginMenu("Edit"))
                {
                    ImGui::MenuItem("Dummy");
                    ImGui::EndMenu();
                }
                ImGui::EndMenuBar();
            }
            ImGui::Text("Hello from popup!");
            ImGui::Button("This is a dummy button..");
            ImGui::EndPopup();
        }

        ImGui::TreePop();
    }

    IMGUI_DEMO_MARKER("Popups/Context menus");
    if (ImGui::TreeNode("Context menus"))
    {
        HelpMarker("\"Context\" functions are simple helpers to associate a Popup to a given Item or Window identifier.");

        // BeginPopupContextItem() is a helper to provide common/simple popup behavior of essentially doing:
        //     if (id == 0)
        //         id = GetItemID(); // Use last item id
        //     if (IsItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
        //         OpenPopup(id);
        //     return BeginPopup(id);
        // For advanced advanced uses you may want to replicate and customize this code.
        // See more details in BeginPopupContextItem().

        // Example 1
        // When used after an item that has an ID (e.g. Button), we can skip providing an ID to BeginPopupContextItem(),
        // and BeginPopupContextItem() will use the last item ID as the popup ID.
        {
            const char* names[5] = { "Label1", "Label2", "Label3", "Label4", "Label5" };
            for (int n = 0; n < 5; n++)
            {
                ImGui::Selectable(names[n]);
                if (ImGui::BeginPopupContextItem()) // <-- use last item id as popup id
                {
                    ImGui::Text("This a popup for \"%s\"!", names[n]);
                    if (ImGui::Button("Close"))
                        ImGui::CloseCurrentPopup();
                    ImGui::EndPopup();
                }
                if (ImGui::IsItemHovered())
                    ImGui::SetTooltip("Right-click to open popup");
            }
        }

        // Example 2
        // Popup on a Text() element which doesn't have an identifier: we need to provide an identifier to BeginPopupContextItem().
        // Using an explicit identifier is also convenient if you want to activate the popups from different locations.
        {
            HelpMarker("Text() elements don't have stable identifiers so we need to provide one.");
            static float value = 0.5f;
            ImGui::Text("Value = %.3f <-- (1) right-click this value", value);
            if (ImGui::BeginPopupContextItem("my popup"))
            {
                if (ImGui::Selectable("Set to zero")) value = 0.0f;
                if (ImGui::Selectable("Set to PI")) value = 3.1415f;
                ImGui::SetNextItemWidth(-FLT_MIN);
                ImGui::DragFloat("##Value", &value, 0.1f, 0.0f, 0.0f);
                ImGui::EndPopup();
            }

            // We can also use OpenPopupOnItemClick() to toggle the visibility of a given popup.
            // Here we make it that right-clicking this other text element opens the same popup as above.
            // The popup itself will be submitted by the code above.
            ImGui::Text("(2) Or right-click this text");
            ImGui::OpenPopupOnItemClick("my popup", ImGuiPopupFlags_MouseButtonRight);

            // Back to square one: manually open the same popup.
            if (ImGui::Button("(3) Or click this button"))
                ImGui::OpenPopup("my popup");
        }

        // Example 3
        // When using BeginPopupContextItem() with an implicit identifier (NULL == use last item ID),
        // we need to make sure your item identifier is stable.
        // In this example we showcase altering the item label while preserving its identifier, using the ### operator (see FAQ).
        {
            HelpMarker("Showcase using a popup ID linked to item ID, with the item having a changing label + stable ID using the ### operator.");
            static char name[32] = "Label1";
            char buf[64];
            sprintf(buf, "Button: %s###Button", name); // ### operator override ID ignoring the preceding label
            ImGui::Button(buf);
            if (ImGui::BeginPopupContextItem())
            {
                ImGui::Text("Edit name:");
                ImGui::InputText("##edit", name, IM_ARRAYSIZE(name));
                if (ImGui::Button("Close"))
                    ImGui::CloseCurrentPopup();
                ImGui::EndPopup();
            }
            ImGui::SameLine(); ImGui::Text("(<-- right-click here)");
        }

        ImGui::TreePop();
    }

    IMGUI_DEMO_MARKER("Popups/Modals");
    if (ImGui::TreeNode("Modals"))
    {
        ImGui::TextWrapped("Modal windows are like popups but the user cannot close them by clicking outside.");

        if (ImGui::Button("Delete.."))
            ImGui::OpenPopup("Delete?");

        // Always center this window when appearing
        ImVec2 center = ImGui::GetMainViewport()->GetCenter();
        ImGui::SetNextWindowPos(center, ImGuiCond_Appearing, ImVec2(0.5f, 0.5f));

        if (ImGui::BeginPopupModal("Delete?", NULL, ImGuiWindowFlags_AlwaysAutoResize))
        {
            ImGui::Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
            ImGui::Separator();

            //static int unused_i = 0;
            //ImGui::Combo("Combo", &unused_i, "Delete\0Delete harder\0");

            static bool dont_ask_me_next_time = false;
            ImGui::PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(0, 0));
            ImGui::Checkbox("Don't ask me next time", &dont_ask_me_next_time);
            ImGui::PopStyleVar();

            if (ImGui::Button("OK", ImVec2(120, 0))) { ImGui::CloseCurrentPopup(); }
            ImGui::SetItemDefaultFocus();
            ImGui::SameLine();
            if (ImGui::Button("Cancel", ImVec2(120, 0))) { ImGui::CloseCurrentPopup(); }
            ImGui::EndPopup();
        }

        if (ImGui::Button("Stacked modals.."))
            ImGui::OpenPopup("Stacked 1");
        if (ImGui::BeginPopupModal("Stacked 1", NULL, ImGuiWindowFlags_MenuBar))
        {
            if (ImGui::BeginMenuBar())
            {
                if (ImGui::BeginMenu("File"))
                {
                    if (ImGui::MenuItem("Some menu item")) {}
                    ImGui::EndMenu();
                }
                ImGui::EndMenuBar();
            }
            ImGui::Text("Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it.");

            // Testing behavior of widgets stacking their own regular popups over the modal.
            static int item = 1;
            static float color[4] = { 0.4f, 0.7f, 0.0f, 0.5f };
            ImGui::Combo("Combo", &item, "aaaa\0bbbb\0cccc\0dddd\0eeee\0\0");
            ImGui::ColorEdit4("color", color);

            if (ImGui::Button("Add another modal.."))
                ImGui::OpenPopup("Stacked 2");

            // Also demonstrate passing a bool* to BeginPopupModal(), this will create a regular close button which
            // will close the popup. Note that the visibility state of popups is owned by imgui, so the input value
            // of the bool actually doesn't matter here.
            bool unused_open = true;
            if (ImGui::BeginPopupModal("Stacked 2", &unused_open))
            {
                ImGui::Text("Hello from Stacked The Second!");
                if (ImGui::Button("Close"))
                    ImGui::CloseCurrentPopup();
                ImGui::EndPopup();
            }

            if (ImGui::Button("Close"))
                ImGui::CloseCurrentPopup();
            ImGui::EndPopup();
        }

        ImGui::TreePop();
    }

    IMGUI_DEMO_MARKER("Popups/Menus inside a regular window");
    if (ImGui::TreeNode("Menus inside a regular window"))
    {
        ImGui::TextWrapped("Below we are testing adding menu items to a regular window. It's rather unusual but should work!");
        ImGui::Separator();

        // Note: As a quirk in this very specific example, we want to differentiate the parent of this menu from the
        // parent of the various popup menus above. To do so we are encloding the items in a PushID()/PopID() block
        // to make them two different menusets. If we don't, opening any popup above and hovering our menu here would
        // open it. This is because once a menu is active, we allow to switch to a sibling menu by just hovering on it,
        // which is the desired behavior for regular menus.
        ImGui::PushID("foo");
        ImGui::MenuItem("Menu item", "CTRL+M");
        if (ImGui::BeginMenu("Menu inside a regular window"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        ImGui::PopID();
        ImGui::Separator();
        ImGui::TreePop();
    }
}